

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

bool polyscope::view::viewIsValid(void)

{
  bool bVar1;
  int i;
  long lVar2;
  int j;
  int iVar3;
  uint *puVar4;
  
  bVar1 = true;
  lVar2 = 0;
LAB_001d069e:
  if (lVar2 == 4) {
    return bVar1;
  }
  iVar3 = 0;
  do {
    puVar4 = &viewMat + lVar2 * 4;
    switch(iVar3) {
    case 1:
      puVar4 = (uint *)(&DAT_0059f6d8 + lVar2 * 0x10);
      break;
    case 2:
      puVar4 = &DAT_0059f6dc + lVar2 * 4;
      break;
    case 3:
      puVar4 = (uint *)(&DAT_0059f6e0 + lVar2 * 0x10);
      break;
    case 4:
      goto switchD_001d06d4_caseD_4;
    }
    iVar3 = iVar3 + 1;
    bVar1 = (bool)(bVar1 & (*puVar4 & 0x7fffffff) < 0x7f800000);
  } while( true );
switchD_001d06d4_caseD_4:
  lVar2 = lVar2 + 1;
  goto LAB_001d069e;
}

Assistant:

bool viewIsValid() {
  bool allFinite = true;
  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
      if (!std::isfinite(viewMat[i][j])) {
        allFinite = false;
      }
    }
  }
  return allFinite;
}